

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O2

unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
__thiscall
duckdb::StandardColumnWriter<int,_int,_duckdb::ParquetCastOperator>::InitializeWriteState
          (StandardColumnWriter<int,_int,_duckdb::ParquetCastOperator> *this,RowGroup *row_group)

{
  pointer pSVar1;
  RowGroup *in_RDX;
  _func_int **local_30;
  unsigned_long local_28;
  
  local_28 = ((long)(in_RDX->columns).
                    super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                    .
                    super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(in_RDX->columns).
                   super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                   .
                   super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x280;
  make_uniq<duckdb::StandardColumnWriterState<int,int,duckdb::ParquetCastOperator>,duckdb::ParquetWriter&,duckdb_parquet::RowGroup&,unsigned_long>
            ((duckdb *)&local_30,
             (ParquetWriter *)
             (row_group->columns).
             super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
             .
             super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
             ._M_impl.super__Vector_impl_data._M_start,in_RDX,&local_28);
  pSVar1 = unique_ptr<duckdb::StandardColumnWriterState<int,_int,_duckdb::ParquetCastOperator>,_std::default_delete<duckdb::StandardColumnWriterState<int,_int,_duckdb::ParquetCastOperator>_>,_true>
           ::operator->((unique_ptr<duckdb::StandardColumnWriterState<int,_int,_duckdb::ParquetCastOperator>,_std::default_delete<duckdb::StandardColumnWriterState<int,_int,_duckdb::ParquetCastOperator>_>,_true>
                         *)&local_30);
  pSVar1->encoding = RLE_DICTIONARY;
  PrimitiveColumnWriter::RegisterToRowGroup((PrimitiveColumnWriter *)row_group,in_RDX);
  (this->super_PrimitiveColumnWriter).super_ColumnWriter._vptr_ColumnWriter = local_30;
  return (unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>)
         (unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>)
         this;
}

Assistant:

unique_ptr<ColumnWriterState> InitializeWriteState(duckdb_parquet::RowGroup &row_group) override {
		auto result = make_uniq<StandardColumnWriterState<SRC, TGT, OP>>(writer, row_group, row_group.columns.size());
		result->encoding = duckdb_parquet::Encoding::RLE_DICTIONARY;
		RegisterToRowGroup(row_group);
		return std::move(result);
	}